

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

float_specs
fmt::v6::internal::parse_float_type_spec<fmt::v6::internal::error_handler,wchar_t>
          (basic_format_specs<wchar_t> *specs,error_handler *eh)

{
  error_handler eVar1;
  byte bVar2;
  char *in_RSI;
  error_handler *in_RDI;
  float_specs result;
  float_specs local_8;
  
  bVar2 = (byte)in_RDI[9] >> 7;
  local_8._4_4_ = (uint)bVar2 << 0x15;
  eVar1 = in_RDI[8];
  if (eVar1 == (error_handler)0x0) {
    local_8 = (float_specs)((ulong)(bVar2 != 0 || 0 < *(int *)(in_RDI + 4)) << 0x35);
    return local_8;
  }
  if (eVar1 == (error_handler)0x41) {
    local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_0020e06a:
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20 | 0x300000000);
  }
  else {
    if (eVar1 == (error_handler)0x45) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_0020dfa1:
      local_8 = (float_specs)
                ((ulong)(local_8._4_4_ & 0xffdfffff | 1 |
                        (uint)((uint)local_8._4_4_ >> 0x15 != 0 || *(int *)(in_RDI + 4) != 0) <<
                        0x15) << 0x20);
      return local_8;
    }
    if (eVar1 == (error_handler)0x46) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_0020e007:
      local_8 = (float_specs)
                ((ulong)(local_8._4_4_ & 0xffdfffff | 2 |
                        (uint)((uint)local_8._4_4_ >> 0x15 != 0 || *(int *)(in_RDI + 4) != 0) <<
                        0x15) << 0x20);
      return local_8;
    }
    if (eVar1 == (error_handler)0x47) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
    }
    else {
      if (eVar1 == (error_handler)0x61) goto LAB_0020e06a;
      if (eVar1 == (error_handler)0x65) goto LAB_0020dfa1;
      if (eVar1 == (error_handler)0x66) goto LAB_0020e007;
      if (eVar1 != (error_handler)0x67) {
        if (eVar1 == (error_handler)0x6e) {
          local_8 = (float_specs)((ulong)bVar2 << 0x35 | 0x2000000000000);
          return local_8;
        }
        error_handler::on_error(in_RDI,in_RSI);
      }
    }
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.showpoint = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.showpoint |= specs.precision > 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
#if FMT_DEPRECATED_PERCENT
  case '%':
    result.format = float_format::fixed;
    result.percent = true;
    break;
#endif
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
  case 'n':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}